

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O2

bool __thiscall test_CECoordinates::test_Convert2Observed(test_CECoordinates *this)

{
  CEDate *this_00;
  CEObserver *this_01;
  CECoordinates *pCVar1;
  CECoordinates *this_02;
  double dVar2;
  undefined1 uVar3;
  allocator local_1a5;
  CECoordinateType local_1a4;
  double local_1a0;
  double local_198;
  CECoordinates obs2obs;
  double zen;
  double az;
  CEAngle local_150 [2];
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  CECoordinates gal2obs;
  CECoordinates icrs2obs;
  CECoordinates testobs;
  CECoordinates cirs2obs;
  
  az = 0.0;
  zen = 0.0;
  CECoordinates::CECoordinates(&testobs);
  this_00 = &this->base_date_;
  local_198 = CEDate::operator_cast_to_double(this_00);
  this_01 = &this->base_observer_;
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_cirs_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&cirs2obs,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&icrs2obs,"test_Convert2Observed",(allocator *)&obs2obs);
  this_02 = &this->base_obs_;
  gal2obs._vptr_CECoordinates._0_4_ = 0x19d;
  (**(code **)(*(long *)this + 200))(this,&cirs2obs,this_02,&icrs2obs);
  std::__cxx11::string::~string((string *)&icrs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&obs2obs);
  CECoordinates::GetObservedCoords(&icrs2obs,pCVar1,this_00,this_01);
  CECoordinates::operator=(&cirs2obs,&icrs2obs);
  CECoordinates::~CECoordinates(&icrs2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&icrs2obs,"test_Convert2Observed",(allocator *)&obs2obs);
  gal2obs._vptr_CECoordinates._0_4_ = 0x1a0;
  (**(code **)(*(long *)this + 200))(this,&cirs2obs,this_02,&icrs2obs);
  std::__cxx11::string::~string((string *)&icrs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&obs2obs);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  icrs2obs._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::CIRS2Observed
            (local_198,local_1a0,&az,&zen,this_00,this_01,(CEAngleType *)&icrs2obs,dVar2,
             (double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&icrs2obs,&az);
  CEAngle::Deg((CEAngle *)&gal2obs,&zen);
  obs2obs._vptr_CECoordinates._0_4_ = 3;
  CECoordinates::SetCoordinates
            (&testobs,(CEAngle *)&icrs2obs,(CEAngle *)&gal2obs,(CECoordinateType *)&obs2obs);
  CEAngle::~CEAngle((CEAngle *)&gal2obs);
  CEAngle::~CEAngle((CEAngle *)&icrs2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&icrs2obs,"test_Convert2Observed",(allocator *)&obs2obs);
  gal2obs._vptr_CECoordinates._0_4_ = 0x1aa;
  (**(code **)(*(long *)this + 200))(this,&testobs,this_02,&icrs2obs);
  std::__cxx11::string::~string((string *)&icrs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&obs2obs);
  local_198 = CEDate::operator_cast_to_double(this_00);
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_icrs_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&icrs2obs,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&gal2obs,"test_Convert2Observed",(allocator *)local_150);
  obs2obs._vptr_CECoordinates._0_4_ = 0x1b9;
  (**(code **)(*(long *)this + 200))(this,&icrs2obs,this_02,&gal2obs);
  std::__cxx11::string::~string((string *)&gal2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  CECoordinates::GetObservedCoords(&gal2obs,pCVar1,this_00,this_01);
  CECoordinates::operator=(&icrs2obs,&gal2obs);
  CECoordinates::~CECoordinates(&gal2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&gal2obs,"test_Convert2Observed",(allocator *)local_150);
  obs2obs._vptr_CECoordinates._0_4_ = 0x1bc;
  (**(code **)(*(long *)this + 200))(this,&icrs2obs,this_02,&gal2obs);
  std::__cxx11::string::~string((string *)&gal2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  gal2obs._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ICRS2Observed
            (local_198,local_1a0,&az,&zen,this_00,this_01,(CEAngleType *)&gal2obs,dVar2,
             (double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&gal2obs,&az);
  CEAngle::Deg((CEAngle *)&obs2obs,&zen);
  local_150[0]._vptr_CEAngle._0_4_ = 3;
  CECoordinates::SetCoordinates
            (&testobs,(CEAngle *)&gal2obs,(CEAngle *)&obs2obs,(CECoordinateType *)local_150);
  CEAngle::~CEAngle((CEAngle *)&obs2obs);
  CEAngle::~CEAngle((CEAngle *)&gal2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&gal2obs,"test_Convert2Observed",(allocator *)local_150);
  obs2obs._vptr_CECoordinates._0_4_ = 0x1c6;
  (**(code **)(*(long *)this + 200))(this,&testobs,this_02,&gal2obs);
  std::__cxx11::string::~string((string *)&gal2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_150);
  local_198 = CEDate::operator_cast_to_double(this_00);
  local_1a0 = CEObserver::Longitude_Rad(this_01);
  local_f8 = CEObserver::Latitude_Rad(this_01);
  local_100 = CEObserver::Elevation_m(this_01);
  local_108 = CEObserver::Pressure_hPa(this_01);
  local_110 = CEObserver::Temperature_C(this_01);
  local_118 = CEObserver::RelativeHumidity(this_01);
  local_120 = CEDate::dut1(this_00);
  local_128 = CEDate::xpolar(this_00);
  local_130 = CEDate::ypolar(this_00);
  pCVar1 = &this->base_gal_;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::ConvertToObserved
            (&gal2obs,pCVar1,local_198,local_1a0,local_f8,local_100,local_108,local_110,local_118,
             local_120,local_128,local_130,dVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&obs2obs,"test_Convert2Observed",(allocator *)&local_1a4);
  local_150[0]._vptr_CEAngle._0_4_ = 0x1d5;
  (**(code **)(*(long *)this + 200))(this,&gal2obs,this_02,&obs2obs);
  std::__cxx11::string::~string((string *)&obs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  CECoordinates::GetObservedCoords(&obs2obs,pCVar1,this_00,this_01);
  CECoordinates::operator=(&gal2obs,&obs2obs);
  CECoordinates::~CECoordinates(&obs2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&obs2obs,"test_Convert2Observed",(allocator *)&local_1a4);
  local_150[0]._vptr_CEAngle._0_4_ = 0x1d8;
  (**(code **)(*(long *)this + 200))(this,&gal2obs,this_02,&obs2obs);
  std::__cxx11::string::~string((string *)&obs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  dVar2 = CppEphem::julian_date_J2000();
  local_198 = CECoordinates::XCoordinate_Deg(pCVar1,dVar2);
  dVar2 = CppEphem::julian_date_J2000();
  local_1a0 = CECoordinates::YCoordinate_Deg(pCVar1,dVar2);
  obs2obs._vptr_CECoordinates._0_4_ = 0;
  dVar2 = CEObserver::Wavelength_um(this_01);
  CECoordinates::Galactic2Observed
            (local_198,local_1a0,&az,&zen,this_00,this_01,(CEAngleType *)&obs2obs,dVar2,
             (double *)0x0,(double *)0x0,(double *)0x0);
  CEAngle::Deg((CEAngle *)&obs2obs,&az);
  CEAngle::Deg(local_150,&zen);
  local_1a4 = OBSERVED;
  CECoordinates::SetCoordinates(&testobs,(CEAngle *)&obs2obs,local_150,&local_1a4);
  CEAngle::~CEAngle(local_150);
  CEAngle::~CEAngle((CEAngle *)&obs2obs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&obs2obs,"test_Convert2Observed",(allocator *)&local_1a4);
  local_150[0]._vptr_CEAngle._0_4_ = 0x1e2;
  (**(code **)(*(long *)this + 200))(this,&testobs,this_02,&obs2obs);
  std::__cxx11::string::~string((string *)&obs2obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a4);
  dVar2 = CEDate::CurrentJD();
  CECoordinates::ConvertToObserved
            (&obs2obs,this_02,dVar2,0.0,0.0,0.0,-1.0,-1000.0,0.0,0.0,0.0,0.0,0.5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"test_Convert2Observed",&local_1a5);
  local_1a4 = 0x1e7;
  (**(code **)(*(long *)this + 0x48))(this,0,local_150);
  std::__cxx11::string::~string((string *)local_150);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a5);
  CECoordinates::~CECoordinates(&obs2obs);
  CECoordinates::GetObservedCoords(&obs2obs,this_02,this_00,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_150,"test_Convert2Observed",&local_1a5);
  local_1a4 = 0x1ed;
  (**(code **)(*(long *)this + 200))(this,&obs2obs,this_02,local_150);
  std::__cxx11::string::~string((string *)local_150);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1a5);
  uVar3 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&obs2obs);
  CECoordinates::~CECoordinates(&gal2obs);
  CECoordinates::~CECoordinates(&icrs2obs);
  CECoordinates::~CECoordinates(&cirs2obs);
  CECoordinates::~CECoordinates(&testobs);
  return (bool)uVar3;
}

Assistant:

bool test_CECoordinates::test_Convert2Observed()
{
    // preliminary variables for observer based conversion
    double az(0.0);
    double zen(0.0);
    CECoordinates testobs;

    // CIRS -> Observed
    CECoordinates cirs2obs = base_cirs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    cirs2obs = base_cirs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(cirs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::CIRS2Observed(base_cirs_.XCoordinate_Deg(),
                                 base_cirs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // ICRS -> Observed
    CECoordinates icrs2obs = base_icrs_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    icrs2obs = base_icrs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(icrs2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::ICRS2Observed(base_icrs_.XCoordinate_Deg(),
                                 base_icrs_.YCoordinate_Deg(),
                                 &az, &zen,
                                 base_date_, base_observer_, 
                                 CEAngleType::DEGREES,
                                 base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Galactic -> Observed
    CECoordinates gal2obs = base_gal_.ConvertToObserved(
                                base_date_,     // date
                                base_observer_.Longitude_Rad(),
                                base_observer_.Latitude_Rad(),
                                base_observer_.Elevation_m(),
                                base_observer_.Pressure_hPa(),
                                base_observer_.Temperature_C(),
                                base_observer_.RelativeHumidity(),
                                base_date_.dut1(),
                                base_date_.xpolar(),
                                base_date_.ypolar(),
                                base_observer_.Wavelength_um());
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // 'GetObservedCoords' method
    gal2obs = base_gal_.GetObservedCoords(base_date_, base_observer_);
    test_coords(gal2obs, base_obs_, __func__, __LINE__);
    // Test the 'CEObserver' based approach
    CECoordinates::Galactic2Observed(base_gal_.XCoordinate_Deg(),
                                     base_gal_.YCoordinate_Deg(),
                                     &az, &zen,
                                     base_date_, base_observer_, 
                                     CEAngleType::DEGREES,
                                     base_observer_.Wavelength_um());
    testobs.SetCoordinates(CEAngle::Deg(az), CEAngle::Deg(zen), 
                           CECoordinateType::OBSERVED);
    test_coords(testobs, base_obs_, __func__, __LINE__);

    // Observed -> Observed
    try {
        CECoordinates obs2obs = base_obs_.ConvertToObserved();
        test(false, __func__, __LINE__);
    } catch (std::exception &e) {
        test(true, __func__, __LINE__);
    }
    // 'GetObservedCoords' method
    CECoordinates obs2obs = base_obs_.GetObservedCoords(base_date_, base_observer_);
    test_coords(obs2obs, base_obs_, __func__, __LINE__);

    return pass();
}